

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

float If_CutAreaRef(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  If_LibLut_t *pIVar2;
  uint *puVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = *(uint *)&pCut->field_0x1c;
  if ((short)uVar1 < 0) {
    fVar6 = (float)p->pPars->nAndArea;
  }
  else if ((uVar1 >> 0xd & 1) == 0) {
    pIVar2 = p->pPars->pLutLib;
    if (pIVar2 == (If_LibLut_t *)0x0) {
      fVar6 = 1.0;
    }
    else {
      fVar6 = pIVar2->pLutAreas[uVar1 >> 0x18];
    }
  }
  else {
    fVar6 = (float)(uVar1 & 0xfff);
  }
  if (0xffffff < uVar1) {
    uVar4 = 0;
    do {
      fVar5 = (&pCut[1].Area)[uVar4];
      if (((long)(int)fVar5 < 0) || (p->vObjs->nSize <= (int)fVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar3 = (uint *)p->vObjs->pArray[(int)fVar5];
      if (puVar3 == (uint *)0x0) {
        return fVar6;
      }
      uVar1 = puVar3[3];
      if ((int)uVar1 < 0) {
        __assert_fail("pLeaf->nRefs >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                      ,0x43b,"float If_CutAreaRef(If_Man_t *, If_Cut_t *)");
      }
      puVar3[3] = uVar1 + 1;
      if ((uVar1 == 0) && ((*puVar3 & 0xf) == 4)) {
        fVar5 = If_CutAreaRef(p,(If_Cut_t *)(puVar3 + 0x14));
        fVar6 = fVar6 + fVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (byte)pCut->field_0x1f);
  }
  return fVar6;
}

Assistant:

float If_CutAreaRef( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Area;
    int i;
    Area = If_CutLutArea(p, pCut);
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->nRefs >= 0 );
        if ( pLeaf->nRefs++ > 0 || !If_ObjIsAnd(pLeaf) )
            continue;
        Area += If_CutAreaRef( p, If_ObjCutBest(pLeaf) );
    }
    return Area;
}